

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_exception_what_method_decl
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool external)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined3 in_register_00000009;
  char *pcVar3;
  
  std::operator<<(out,"const char* ");
  if (CONCAT31(in_register_00000009,external) == 0) {
    std::operator<<(out,"what() const noexcept");
    pcVar3 = " override";
  }
  else {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar2 = std::operator<<(out,(string *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar2,"::");
    pcVar3 = "what() const noexcept";
  }
  std::operator<<(out,pcVar3);
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method_decl(std::ostream& out,
                                                          t_struct* tstruct,
                                                          bool external) {
  out << "const char* ";
  if (external) {
    out << tstruct->get_name() << "::";
  }
  out << "what() const noexcept";
  if(!external)
    out << " override";
}